

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

Texture * rw::Texture::streamRead(Stream *stream)

{
  FILE *pFVar1;
  bool bVar2;
  bool32 b;
  bool32 b_00;
  uint uVar3;
  char *pcVar4;
  Texture *this;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __nbytes;
  Texture *tex;
  int32 filter;
  bool32 autoMipState;
  bool32 mipState;
  Error _e_2;
  Error _e_1;
  uint32 filterAddressing;
  Error _e;
  char mask [128];
  char name [128];
  uint local_1c;
  Stream *pSStack_18;
  uint32 length;
  Stream *stream_local;
  
  pSStack_18 = stream;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    _e_1.plugin = Stream::readU32(pSStack_18);
    if ((_e_1.plugin & 0xf000) == 0) {
      _e_1.plugin = (_e_1.plugin & 0xf00) << 4 | _e_1.plugin;
    }
    bVar2 = findChunk(pSStack_18,2,&local_1c,(uint32 *)0x0);
    if (bVar2) {
      (*pSStack_18->_vptr_Stream[4])(pSStack_18,mask + 0x78,(ulong)local_1c);
      bVar2 = findChunk(pSStack_18,2,&local_1c,(uint32 *)0x0);
      if (bVar2) {
        (*pSStack_18->_vptr_Stream[4])(pSStack_18,&_e,(ulong)local_1c);
        b = getMipmapping();
        b_00 = getAutoMipmapping();
        uVar3 = _e_1.plugin & 0xff;
        if ((((uVar3 == 3) || (uVar3 == 4)) || (uVar3 == 5)) || (uVar3 == 6)) {
          setMipmapping(1);
          setAutoMipmapping((uint)((_e_1.plugin & 0x10000) == 0));
          __nbytes = extraout_RDX;
        }
        else {
          setMipmapping(0);
          setAutoMipmapping(0);
          __nbytes = extraout_RDX_00;
        }
        this = (Texture *)read((int)mask + 0x78,&_e,__nbytes);
        setMipmapping(b);
        setAutoMipmapping(b_00);
        if (this == (Texture *)0x0) {
          PluginList::streamSkip((PluginList *)&s_plglist,pSStack_18);
          stream_local = (Stream *)0x0;
        }
        else {
          if (this->refCount == 1) {
            this->filterAddressing = _e_1.plugin & 0xffff;
          }
          bVar2 = PluginList::streamRead((PluginList *)&s_plglist,pSStack_18,this);
          stream_local = (Stream *)this;
          if (!bVar2) {
            destroy(this);
            stream_local = (Stream *)0x0;
          }
        }
      }
      else {
        autoMipState = 0;
        mipState = -0x7ffffffc;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
                ,0x185);
        pFVar1 = _stderr;
        pcVar4 = dbgsprint(0x80000004,"STRING");
        fprintf(pFVar1,"%s\n",pcVar4);
        setError((Error *)&autoMipState);
        stream_local = (Stream *)0x0;
      }
    }
    else {
      _e_2.plugin = 0;
      _e_2.code = 0x80000004;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
              ,0x17f);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x80000004,"STRING");
      fprintf(pFVar1,"%s\n",pcVar4);
      setError(&_e_2);
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.code = 0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
            ,0x173);
    pFVar1 = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar4);
    setError((Error *)&_e_1.code);
    stream_local = (Stream *)0x0;
  }
  return (Texture *)stream_local;
}

Assistant:

Texture*
Texture::streamRead(Stream *stream)
{
	uint32 length;
	char name[128], mask[128];
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	uint32 filterAddressing = stream->readU32();
	// if V addressing is 0, copy U
	if((filterAddressing & 0xF000) == 0)
		filterAddressing |= (filterAddressing&0xF00) << 4;

	// if using mipmap filter mode, set automipmapping,
	// if 0x10000 is set, set mipmapping

	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		return nil;
	}
	stream->read8(name, length);

	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		return nil;
	}
	stream->read8(mask, length);

	bool32 mipState = getMipmapping();
	bool32 autoMipState = getAutoMipmapping();
	int32 filter = filterAddressing&0xFF;
	if(filter == MIPNEAREST || filter == MIPLINEAR ||
	   filter == LINEARMIPNEAREST || filter == LINEARMIPLINEAR){
		setMipmapping(1);
		setAutoMipmapping((filterAddressing&0x10000) == 0);
	}else{
		setMipmapping(0);
		setAutoMipmapping(0);
	}

	Texture *tex = Texture::read(name, mask);

	setMipmapping(mipState);
	setAutoMipmapping(autoMipState);

	if(tex == nil){
		s_plglist.streamSkip(stream);
		return nil;
	}
	if(tex->refCount == 1)
		tex->filterAddressing = filterAddressing&0xFFFF;

	if(s_plglist.streamRead(stream, tex))
		return tex;

	tex->destroy();
	return nil;
}